

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_math.c
# Opt level: O0

double p2sc_circleoverlap(double R,double r,double d)

{
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double a2;
  double a1;
  double ia;
  double d2;
  double r2;
  double R2;
  double f;
  double local_28;
  double local_8;
  
  dVar1 = in_XMM0_Qa * in_XMM0_Qa;
  dVar2 = in_XMM1_Qa * in_XMM1_Qa;
  if (in_XMM2_Qa < in_XMM0_Qa + in_XMM1_Qa) {
    local_28 = dVar2 / dVar1;
    if ((in_XMM2_Qa != 0.0) || (NAN(in_XMM2_Qa))) {
      dVar3 = ((in_XMM2_Qa * in_XMM2_Qa + dVar2) - dVar1) / (in_XMM2_Qa * 2.0 * in_XMM1_Qa);
      dVar4 = ((in_XMM2_Qa * in_XMM2_Qa + dVar1) - dVar2) / (in_XMM2_Qa * 2.0 * in_XMM0_Qa);
      if ((ABS(dVar3) <= 1.0) && (ABS(dVar4) <= 1.0)) {
        dVar3 = acos(dVar3);
        dVar4 = acos(dVar4);
        dVar5 = sqrt((-in_XMM2_Qa + in_XMM1_Qa + in_XMM0_Qa) *
                     ((in_XMM2_Qa + in_XMM1_Qa) - in_XMM0_Qa) *
                     ((in_XMM2_Qa - in_XMM1_Qa) + in_XMM0_Qa) *
                     (in_XMM2_Qa + in_XMM1_Qa + in_XMM0_Qa));
        local_28 = (dVar5 * -0.5 + dVar2 * dVar3 + dVar1 * dVar4) / (dVar1 * 3.141592653589793);
      }
    }
    if (1.0 < local_28) {
      local_28 = 1.0;
    }
    local_8 = local_28;
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

double p2sc_circleoverlap(double R, double r, double d) {
    double f, R2 = R * R, r2 = r * r, d2 = d * d;

    if (d >= R + r)
        return 0;

    f = r2 / R2;

    if (d) {
        double ia;
        double a1 = (d2 + r2 - R2) / (2 * d * r);
        double a2 = (d2 + R2 - r2) / (2 * d * R);

        if (fabs(a1) <= 1 && fabs(a2) <= 1) {
            ia = r2 * acos(a1) + R2 * acos(a2) -
                0.5 * sqrt((-d + r + R) * (d + r - R) * (d - r + R) * (d + r + R));

            f = ia / (M_PI * R2);
        }
    }

    if (f > 1)
        f = 1;

    return f;
}